

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O2

void comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst,QRgbaFloat32 *src,int length,uint const_alpha)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  float in_register_0000129c;
  float in_register_000012dc;
  
  if (const_alpha == 0xff) {
    memcpy(dst,src,(long)length << 4);
    return;
  }
  fVar19 = (float)const_alpha / 255.0;
  fVar4 = 1.0 - fVar19;
  lVar17 = 0;
  for (lVar18 = 0; lVar18 < length + -1; lVar18 = lVar18 + 2) {
    pfVar1 = (float *)((long)&src->r + lVar17);
    fVar5 = pfVar1[1];
    fVar6 = pfVar1[2];
    fVar7 = pfVar1[3];
    fVar8 = pfVar1[4];
    fVar9 = pfVar1[5];
    fVar10 = pfVar1[6];
    pfVar2 = (float *)((long)&dst->r + lVar17);
    fVar11 = pfVar2[1];
    fVar12 = pfVar2[2];
    fVar13 = pfVar2[3];
    fVar14 = pfVar2[4];
    fVar15 = pfVar2[5];
    fVar16 = pfVar2[6];
    in_register_0000129c = in_register_0000129c + in_register_000012dc;
    pfVar3 = (float *)((long)&dst->r + lVar17);
    *pfVar3 = fVar19 * *pfVar1 + fVar4 * *pfVar2;
    pfVar3[1] = fVar19 * fVar5 + fVar4 * fVar11;
    pfVar3[2] = fVar19 * fVar6 + fVar4 * fVar12;
    pfVar3[3] = fVar19 * fVar7 + fVar4 * fVar13;
    pfVar3[4] = fVar19 * fVar8 + fVar4 * fVar14;
    pfVar3[5] = fVar19 * fVar9 + fVar4 * fVar15;
    pfVar3[6] = fVar19 * fVar10 + fVar4 * fVar16;
    pfVar3[7] = in_register_0000129c;
    lVar17 = lVar17 + 0x20;
  }
  if ((int)lVar18 < length) {
    pfVar1 = (float *)((long)&src->r + lVar17);
    fVar5 = pfVar1[1];
    fVar6 = pfVar1[2];
    fVar7 = pfVar1[3];
    pfVar2 = (float *)((long)&dst->r + lVar17);
    fVar8 = pfVar2[1];
    fVar9 = pfVar2[2];
    fVar10 = pfVar2[3];
    pfVar3 = (float *)((long)&dst->r + lVar17);
    *pfVar3 = fVar19 * *pfVar1 + fVar4 * *pfVar2;
    pfVar3[1] = fVar19 * fVar5 + fVar4 * fVar8;
    pfVar3[2] = fVar19 * fVar6 + fVar4 * fVar9;
    pfVar3[3] = fVar19 * fVar7 + fVar4 * fVar10;
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_Source_rgbafp_avx2(QRgbaFloat32 *dst, const QRgbaFloat32 *src, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        ::memcpy(dst, src, length * sizeof(QRgbaFloat32));
    } else {
        const float ca = const_alpha / 255.f;
        const float cia = 1.0f - ca;

        const __m128 constAlphaVector = _mm_set1_ps(ca);
        const __m128 oneMinusConstAlpha =  _mm_set1_ps(cia);
        const __m256 constAlphaVector256 = _mm256_set1_ps(ca);
        const __m256 oneMinusConstAlpha256 =  _mm256_set1_ps(cia);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 srcVector = _mm256_loadu_ps((const float *)&src[x]);
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            srcVector = _mm256_mul_ps(srcVector, constAlphaVector256);
            dstVector = _mm256_mul_ps(dstVector, oneMinusConstAlpha256);
            dstVector = _mm256_add_ps(dstVector, srcVector);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 srcVector = _mm_loadu_ps((const float *)&src[x]);
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            srcVector = _mm_mul_ps(srcVector, constAlphaVector);
            dstVector = _mm_mul_ps(dstVector, oneMinusConstAlpha);
            dstVector = _mm_add_ps(dstVector, srcVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}